

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  int32 n;
  Floor *pFVar8;
  int16 *piVar9;
  float *pfVar10;
  short *psVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint32 uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint8 *puVar23;
  long lVar24;
  uint uVar25;
  byte *pbVar26;
  short sVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  char *pcVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  float *a;
  float *pfVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  Codebook *pCVar42;
  long lVar43;
  ulong uVar44;
  bool bVar45;
  float fVar46;
  float fVar47;
  int n2;
  int right_end;
  int mode;
  int left_end;
  float *residue_buffers [16];
  int really_zero_channel [256];
  int zero_channel [256];
  int local_9d8;
  int local_9d4;
  int *local_9d0;
  int *local_9c8;
  int local_9bc;
  float *local_9b8 [16];
  uint8 local_938 [256];
  undefined4 local_838;
  int local_438 [258];
  
  local_9c8 = len;
  iVar14 = vorbis_decode_initial(f,p_left,&local_9bc,p_right,&local_9d8,&local_9d4);
  if (iVar14 == 0) {
    return 0;
  }
  lVar22 = (long)local_9d4;
  iVar14 = *p_left;
  iVar21 = *p_right;
  iVar7 = f->blocksize[f->mode_config[lVar22].blockflag];
  puVar23 = f->mapping->submap_floor + ((ulong)((uint)f->mode_config[lVar22].mapping * 0x30) - 0x11)
  ;
  iVar16 = f->channels;
  local_9d0 = p_left;
  if (0 < iVar16) {
    lVar43 = 0;
    do {
      bVar3 = *(byte *)(*(long *)(puVar23 + 8) + 2 + lVar43 * 3);
      local_438[lVar43] = 0;
      uVar44 = (ulong)puVar23[(ulong)bVar3 + 0x11];
      if (f->floor_types[uVar44] == 0) {
        f->error = VORBIS_invalid_stream;
        return 0;
      }
      pFVar8 = f->floor_config;
      uVar15 = get_bits(f,1);
      if (uVar15 == 0) {
LAB_00115436:
        local_438[lVar43] = 1;
      }
      else {
        pFVar1 = pFVar8 + uVar44;
        n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
        piVar9 = f->finalY[lVar43];
        iVar16 = ilog(n);
        uVar15 = get_bits(f,iVar16 + -1);
        *piVar9 = (int16)uVar15;
        uVar15 = get_bits(f,iVar16 + -1);
        piVar9[1] = (int16)uVar15;
        if ((pFVar1->floor0).order != '\0') {
          lVar38 = 2;
          uVar32 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar1 + uVar32 + 1);
            uVar34 = (ulong)bVar3;
            uVar18 = (uint)*(byte *)((long)pFVar1 + uVar34 + 0x21);
            bVar4 = *(byte *)((long)pFVar1 + uVar34 + 0x31);
            if (bVar4 == 0) {
              uVar30 = 0;
            }
            else {
              pCVar42 = f->codebooks + *(byte *)((long)pFVar1 + uVar34 + 0x41);
              if (f->valid_bits < 10) {
                if (f->valid_bits == 0) {
                  f->acc = 0;
                }
                do {
                  if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                     (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                  iVar31 = f->valid_bits;
                  f->acc = f->acc + (iVar16 << ((byte)iVar31 & 0x1f));
                  f->valid_bits = iVar31 + 8;
                } while (iVar31 < 0x11);
              }
              sVar27 = pCVar42->fast_huffman[f->acc & 0x3ff];
              if (sVar27 < 0) {
                uVar30 = codebook_decode_scalar_raw(f,pCVar42);
              }
              else {
                bVar5 = pCVar42->codeword_lengths[(int)sVar27];
                f->acc = f->acc >> (bVar5 & 0x1f);
                iVar16 = f->valid_bits - (uint)bVar5;
                bVar45 = iVar16 < 0;
                if (iVar16 < 1) {
                  iVar16 = 0;
                }
                uVar30 = (int)sVar27;
                if (bVar45) {
                  uVar30 = 0xffffffff;
                }
                f->valid_bits = iVar16;
              }
              if (pCVar42->sparse != '\0') {
                uVar30 = pCVar42->sorted_values[(int)uVar30];
              }
            }
            if (uVar18 != 0) {
              lVar38 = (long)(int)lVar38;
              uVar39 = 0;
              do {
                lVar24 = (long)*(short *)((long)pFVar1 +
                                         (ulong)(uVar30 & ~(-1 << (bVar4 & 0x1f))) * 2 +
                                         (ulong)bVar3 * 0x10 + 0x52);
                uVar30 = (int)uVar30 >> (bVar4 & 0x1f);
                if (lVar24 < 0) {
                  iVar16 = 0;
                }
                else {
                  pCVar42 = f->codebooks + lVar24;
                  if (f->valid_bits < 10) {
                    if (f->valid_bits == 0) {
                      f->acc = 0;
                    }
                    do {
                      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                         (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                      iVar31 = f->valid_bits;
                      f->acc = f->acc + (iVar16 << ((byte)iVar31 & 0x1f));
                      f->valid_bits = iVar31 + 8;
                    } while (iVar31 < 0x11);
                  }
                  iVar16 = (int)pCVar42->fast_huffman[f->acc & 0x3ff];
                  if (pCVar42->fast_huffman[f->acc & 0x3ff] < 0) {
                    iVar16 = codebook_decode_scalar_raw(f,pCVar42);
                  }
                  else {
                    bVar5 = pCVar42->codeword_lengths[iVar16];
                    f->acc = f->acc >> (bVar5 & 0x1f);
                    iVar28 = f->valid_bits - (uint)bVar5;
                    iVar31 = iVar28;
                    if (iVar28 < 1) {
                      iVar31 = 0;
                    }
                    if (iVar28 < 0) {
                      iVar16 = -1;
                    }
                    f->valid_bits = iVar31;
                  }
                  if (pCVar42->sparse != '\0') {
                    iVar16 = pCVar42->sorted_values[iVar16];
                  }
                }
                piVar9[lVar38] = (int16)iVar16;
                lVar38 = lVar38 + 1;
                uVar39 = uVar39 + 1;
              } while (uVar39 != uVar18);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < (pFVar1->floor0).order);
        }
        if (f->valid_bits == -1) goto LAB_00115436;
        local_838._0_2_ = 0x101;
        iVar16 = (pFVar1->floor1).values;
        lVar38 = (long)iVar16;
        if (2 < lVar38) {
          lVar24 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar8 + lVar24 * 2 + uVar44 * 0x63c + 0x444);
            bVar4 = *(byte *)((long)pFVar8 + lVar24 * 2 + uVar44 * 0x63c + 0x445);
            iVar28 = (int)*(short *)((long)piVar9 + (ulong)((uint)bVar3 + (uint)bVar3));
            iVar31 = (int)*(short *)((long)piVar9 + (ulong)((uint)bVar4 + (uint)bVar4));
            uVar39 = (uint)*(ushort *)((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
            uVar30 = iVar31 - iVar28;
            uVar18 = -uVar30;
            if (0 < (int)uVar30) {
              uVar18 = uVar30;
            }
            iVar17 = (int)((*(ushort *)((long)pFVar8 + lVar24 * 2 + uVar44 * 0x63c + 0x156) - uVar39
                           ) * (uVar18 & 0xffff)) /
                     (int)(*(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152) -
                          uVar39);
            iVar29 = -iVar17;
            if (-1 < iVar31 - iVar28) {
              iVar29 = iVar17;
            }
            iVar29 = iVar29 + iVar28;
            sVar27 = piVar9[lVar24 + 2];
            uVar18 = (uint)sVar27;
            if (uVar18 == 0) {
              *(undefined1 *)((long)&local_838 + lVar24 + 2) = 0;
LAB_001153eb:
              sVar27 = (short)iVar29;
LAB_001153f0:
              piVar9[lVar24 + 2] = sVar27;
            }
            else {
              iVar28 = n - iVar29;
              iVar31 = iVar29;
              if (iVar28 < iVar29) {
                iVar31 = iVar28;
              }
              *(undefined1 *)((long)&local_838 + (ulong)bVar4) = 1;
              *(undefined1 *)((long)&local_838 + (ulong)bVar3) = 1;
              *(undefined1 *)((long)&local_838 + lVar24 + 2) = 1;
              if ((int)uVar18 < iVar31 * 2) {
                if ((uVar18 & 1) == 0) {
                  iVar29 = iVar29 + (uVar18 >> 1);
                }
                else {
                  iVar29 = iVar29 - (uVar18 + 1 >> 1);
                }
                goto LAB_001153eb;
              }
              if (iVar28 <= iVar29) {
                sVar27 = ((short)iVar29 - sVar27) + (short)iVar28 + -1;
                goto LAB_001153f0;
              }
            }
            lVar24 = lVar24 + 1;
          } while (lVar38 + -2 != lVar24);
        }
        if (0 < iVar16) {
          lVar24 = 0;
          do {
            if (*(char *)((long)&local_838 + lVar24) == '\0') {
              piVar9[lVar24] = -1;
            }
            lVar24 = lVar24 + 1;
          } while (lVar38 != lVar24);
        }
      }
      lVar43 = lVar43 + 1;
      iVar16 = f->channels;
    } while (lVar43 < iVar16);
  }
  pcVar33 = (f->alloc).alloc_buffer;
  if ((pcVar33 != (char *)0x0) && ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xccd,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  memcpy(&local_838,local_438,(long)iVar16 << 2);
  uVar6 = *(ushort *)puVar23;
  if ((ulong)uVar6 != 0) {
    lVar43 = *(long *)(puVar23 + 8);
    lVar38 = 0;
    do {
      bVar3 = *(byte *)(lVar43 + lVar38);
      if (local_438[bVar3] == 0) {
        uVar44 = (ulong)*(byte *)(lVar43 + 1 + lVar38);
LAB_001154d3:
        local_438[uVar44] = 0;
        local_438[bVar3] = 0;
      }
      else {
        uVar44 = (ulong)*(byte *)(lVar43 + 1 + lVar38);
        if (local_438[uVar44] == 0) goto LAB_001154d3;
      }
      lVar38 = lVar38 + 3;
    } while ((ulong)uVar6 * 3 != lVar38);
  }
  uVar18 = iVar7 >> 1;
  if (puVar23[0x10] != '\0') {
    uVar44 = 0;
    do {
      iVar16 = f->channels;
      iVar31 = 0;
      if (0 < (long)iVar16) {
        pbVar26 = (byte *)(*(long *)(puVar23 + 8) + 2);
        lVar43 = 0;
        iVar31 = 0;
        do {
          if (uVar44 == *pbVar26) {
            if (local_438[lVar43] == 0) {
              pfVar37 = f->channel_buffers[lVar43];
            }
            else {
              pfVar37 = (float *)0x0;
            }
            local_938[iVar31] = local_438[lVar43] != 0;
            local_9b8[iVar31] = pfVar37;
            iVar31 = iVar31 + 1;
          }
          lVar43 = lVar43 + 1;
          pbVar26 = pbVar26 + 3;
        } while (iVar16 != lVar43);
      }
      decode_residue(f,local_9b8,iVar31,uVar18,(uint)puVar23[uVar44 + 0x20],local_938);
      uVar44 = uVar44 + 1;
    } while (uVar44 < puVar23[0x10]);
    pcVar33 = (f->alloc).alloc_buffer;
  }
  if ((pcVar33 != (char *)0x0) && ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xcee,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  if ((ulong)*(ushort *)puVar23 != 0) {
    lVar43 = *(long *)(puVar23 + 8);
    uVar44 = (ulong)*(ushort *)puVar23;
    do {
      if (0 < (int)uVar18) {
        lVar38 = (uVar44 - 1) * 3;
        pfVar37 = f->channel_buffers[*(byte *)(lVar43 + lVar38)];
        pfVar10 = f->channel_buffers[*(byte *)(lVar43 + 1 + lVar38)];
        uVar32 = 0;
        do {
          fVar47 = pfVar37[uVar32];
          fVar2 = pfVar10[uVar32];
          fVar46 = fVar47;
          if (fVar47 <= 0.0) {
            if (fVar2 <= 0.0) {
              fVar46 = fVar47 - fVar2;
            }
            else {
              fVar47 = fVar2 + fVar47;
            }
          }
          else if (fVar2 <= 0.0) {
            fVar46 = fVar2 + fVar47;
          }
          else {
            fVar47 = fVar47 - fVar2;
          }
          pfVar37[uVar32] = fVar46;
          pfVar10[uVar32] = fVar47;
          uVar32 = uVar32 + 1;
        } while (uVar18 != uVar32);
      }
      bVar45 = 1 < (long)uVar44;
      uVar44 = uVar44 - 1;
    } while (bVar45);
  }
  iVar16 = f->channels;
  if (0 < iVar16) {
    lVar43 = 0;
    do {
      pfVar37 = f->channel_buffers[lVar43];
      if ((&local_838)[lVar43] == 0) {
        if (f->floor_types
            [puVar23[(ulong)*(byte *)(*(long *)(puVar23 + 8) + 2 + lVar43 * 3) + 0x11]] == 0) {
          f->error = VORBIS_invalid_stream;
        }
        else {
          psVar11 = f->finalY[lVar43];
          pFVar8 = f->floor_config;
          lVar38 = (ulong)puVar23[(ulong)*(byte *)(*(long *)(puVar23 + 8) + 2 + lVar43 * 3) + 0x11]
                   * 0x63c;
          bVar3 = *(byte *)((long)pFVar8 + lVar38 + 0x634);
          uVar39 = (int)*psVar11 * (uint)bVar3;
          lVar24 = (long)*(int *)((long)pFVar8 + lVar38 + 0x638);
          uVar30 = 0;
          if (1 < lVar24) {
            uVar30 = 0;
            lVar36 = 1;
            do {
              uVar44 = (ulong)*(byte *)((long)pFVar8 + lVar36 + lVar38 + 0x346);
              sVar27 = psVar11[uVar44];
              uVar25 = uVar39;
              uVar13 = uVar30;
              if (-1 < sVar27) {
                uVar25 = (int)sVar27 * (uint)bVar3;
                uVar19 = (uint)*(ushort *)((long)pFVar8 + uVar44 * 2 + lVar38 + 0x152);
                iVar31 = uVar19 - uVar30;
                if (iVar31 != 0) {
                  iVar29 = uVar25 - uVar39;
                  iVar28 = -iVar29;
                  if (0 < iVar29) {
                    iVar28 = iVar29;
                  }
                  iVar20 = iVar29 / iVar31;
                  iVar17 = -iVar20;
                  if (0 < iVar20) {
                    iVar17 = iVar20;
                  }
                  uVar12 = uVar18;
                  if ((int)uVar19 < (int)uVar18) {
                    uVar12 = uVar19;
                  }
                  uVar13 = uVar19;
                  if ((int)uVar30 < (int)uVar12) {
                    pfVar37[uVar30] = inverse_db_table[uVar39 & 0xff] * pfVar37[uVar30];
                    if ((int)(uVar30 + 1) < (int)uVar12) {
                      iVar40 = 0;
                      lVar35 = 1;
                      do {
                        iVar40 = iVar40 + (iVar28 - iVar17 * iVar31);
                        uVar19 = 0;
                        iVar41 = 0;
                        if (iVar31 <= iVar40) {
                          uVar19 = iVar29 >> 0x1f | 1;
                          iVar41 = iVar31;
                        }
                        uVar39 = uVar39 + iVar20 + uVar19;
                        iVar40 = iVar40 - iVar41;
                        pfVar37[(ulong)uVar30 + lVar35] =
                             inverse_db_table[uVar39 & 0xff] * pfVar37[(ulong)uVar30 + lVar35];
                        lVar35 = lVar35 + 1;
                      } while (uVar12 - uVar30 != (int)lVar35);
                    }
                  }
                }
              }
              uVar30 = uVar13;
              uVar39 = uVar25;
              lVar36 = lVar36 + 1;
            } while (lVar36 != lVar24);
          }
          if ((int)uVar30 < (int)uVar18) {
            fVar47 = inverse_db_table[(int)uVar39];
            uVar44 = (ulong)uVar30;
            do {
              pfVar37[uVar44] = pfVar37[uVar44] * fVar47;
              uVar44 = uVar44 + 1;
            } while ((long)(int)uVar18 != uVar44);
          }
        }
      }
      else {
        memset(pfVar37,0,(long)(int)uVar18 * 4);
        iVar16 = f->channels;
      }
      lVar43 = lVar43 + 1;
    } while (lVar43 < iVar16);
    if (0 < iVar16) {
      lVar43 = 0;
      do {
        inverse_mdct(f->channel_buffers[lVar43],iVar7,f,(uint)f->mode_config[lVar22].blockflag);
        lVar43 = lVar43 + 1;
      } while (lVar43 < f->channels);
    }
  }
  do {
    iVar16 = get8_packet_raw(f);
  } while (iVar16 != -1);
  if (f->first_decode == '\0') {
    iVar7 = f->discard_samples_deferred;
    if (iVar7 != 0) {
      if (iVar7 < iVar21 - iVar14) {
        *local_9d0 = iVar14 + iVar7;
        f->discard_samples_deferred = 0;
        iVar14 = iVar14 + iVar7;
      }
      else {
        f->discard_samples_deferred = iVar7 - (iVar21 - iVar14);
        *local_9d0 = iVar21;
        iVar14 = iVar21;
      }
    }
  }
  else {
    f->current_loc = -uVar18;
    f->discard_samples_deferred = iVar7 - local_9d8;
    f->current_loc_valid = 1;
    f->first_decode = '\0';
  }
  if (f->last_seg_which == f->end_seg_with_known_loc) {
    if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
      uVar30 = f->current_loc;
      uVar39 = f->known_loc_for_packet;
      if (uVar39 < (local_9d8 - iVar14) + uVar30) {
        iVar21 = uVar39 - uVar30;
        if (uVar39 < uVar30) {
          iVar21 = 0;
        }
        iVar7 = iVar21 + iVar14;
        if (local_9d8 <= iVar21 + iVar14) {
          iVar7 = local_9d8;
        }
        *local_9c8 = iVar7;
        f->current_loc = f->current_loc + iVar7;
        return 1;
      }
    }
    uVar15 = (iVar14 - uVar18) + f->known_loc_for_packet;
    f->current_loc_valid = 1;
  }
  else {
    if (f->current_loc_valid == 0) goto LAB_00115a29;
    uVar15 = f->current_loc;
  }
  f->current_loc = (iVar21 - iVar14) + uVar15;
LAB_00115a29:
  if (((f->alloc).alloc_buffer != (char *)0x0) &&
     ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xd62,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  *local_9c8 = local_9d8;
  return 1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}